

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O1

int32_t __thiscall
icu_63::StringTrieBuilder::writeNode
          (StringTrieBuilder *this,int32_t start,int32_t limit,int32_t unitIndex)

{
  _func_int **pp_Var1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint local_3c;
  byte local_38;
  
  iVar2 = (*(this->super_UObject)._vptr_UObject[3])();
  if (iVar2 == unitIndex) {
    uVar7 = (ulong)(start + 1U);
    local_3c = (*(this->super_UObject)._vptr_UObject[5])(this,(ulong)(uint)start);
    if (start + 1U == limit) {
      iVar2 = (*(this->super_UObject)._vptr_UObject[0x11])(this,(ulong)local_3c,1);
      return iVar2;
    }
    local_38 = 1;
  }
  else {
    local_3c = 0;
    local_38 = 0;
    uVar7 = (ulong)(uint)start;
  }
  iVar2 = (*(this->super_UObject)._vptr_UObject[4])(this,uVar7,(ulong)(uint)unitIndex);
  iVar3 = (*(this->super_UObject)._vptr_UObject[4])(this,(ulong)(limit - 1U),(ulong)(uint)unitIndex)
  ;
  pp_Var1 = (this->super_UObject)._vptr_UObject;
  if ((short)iVar2 == (short)iVar3) {
    iVar2 = (*pp_Var1[6])(this,uVar7,(ulong)(limit - 1U),(ulong)(uint)unitIndex);
    writeNode(this,(int32_t)uVar7,limit,iVar2);
    uVar5 = iVar2 - unitIndex;
    uVar4 = (*(this->super_UObject)._vptr_UObject[0xd])(this);
    if ((int)uVar4 < (int)uVar5) {
      uVar6 = iVar2 - uVar4;
      do {
        uVar5 = uVar5 - uVar4;
        (*(this->super_UObject)._vptr_UObject[0x10])(this,uVar7,(ulong)uVar6,(ulong)uVar4);
        iVar2 = (*(this->super_UObject)._vptr_UObject[0xc])(this);
        (*(this->super_UObject)._vptr_UObject[0xf])(this,(ulong)(iVar2 + (uVar4 - 1)));
        uVar6 = uVar6 - uVar4;
      } while ((int)uVar4 < (int)uVar5);
    }
    (*(this->super_UObject)._vptr_UObject[0x10])(this,uVar7,(ulong)(uint)unitIndex,(ulong)uVar5);
    iVar2 = (*(this->super_UObject)._vptr_UObject[0xc])(this);
    uVar4 = (uVar5 + iVar2) - 1;
  }
  else {
    iVar2 = (*pp_Var1[7])(this,uVar7,(ulong)(uint)limit,(ulong)(uint)unitIndex);
    writeBranchSubNode(this,(int32_t)uVar7,limit,unitIndex,iVar2);
    uVar4 = iVar2 - 1;
    iVar3 = (*(this->super_UObject)._vptr_UObject[0xc])(this);
    if (iVar3 < iVar2) {
      (*(this->super_UObject)._vptr_UObject[0xf])(this,(ulong)uVar4);
      uVar4 = 0;
    }
  }
  iVar2 = (*(this->super_UObject)._vptr_UObject[0x12])
                    (this,(ulong)local_38,(ulong)local_3c,(ulong)uVar4);
  return iVar2;
}

Assistant:

int32_t
StringTrieBuilder::writeNode(int32_t start, int32_t limit, int32_t unitIndex) {
    UBool hasValue=FALSE;
    int32_t value=0;
    int32_t type;
    if(unitIndex==getElementStringLength(start)) {
        // An intermediate or final value.
        value=getElementValue(start++);
        if(start==limit) {
            return writeValueAndFinal(value, TRUE);  // final-value node
        }
        hasValue=TRUE;
    }
    // Now all [start..limit[ strings are longer than unitIndex.
    int32_t minUnit=getElementUnit(start, unitIndex);
    int32_t maxUnit=getElementUnit(limit-1, unitIndex);
    if(minUnit==maxUnit) {
        // Linear-match node: All strings have the same character at unitIndex.
        int32_t lastUnitIndex=getLimitOfLinearMatch(start, limit-1, unitIndex);
        writeNode(start, limit, lastUnitIndex);
        // Break the linear-match sequence into chunks of at most kMaxLinearMatchLength.
        int32_t length=lastUnitIndex-unitIndex;
        int32_t maxLinearMatchLength=getMaxLinearMatchLength();
        while(length>maxLinearMatchLength) {
            lastUnitIndex-=maxLinearMatchLength;
            length-=maxLinearMatchLength;
            writeElementUnits(start, lastUnitIndex, maxLinearMatchLength);
            write(getMinLinearMatch()+maxLinearMatchLength-1);
        }
        writeElementUnits(start, unitIndex, length);
        type=getMinLinearMatch()+length-1;
    } else {
        // Branch node.
        int32_t length=countElementUnits(start, limit, unitIndex);
        // length>=2 because minUnit!=maxUnit.
        writeBranchSubNode(start, limit, unitIndex, length);
        if(--length<getMinLinearMatch()) {
            type=length;
        } else {
            write(length);
            type=0;
        }
    }
    return writeValueAndType(hasValue, value, type);
}